

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::GBufferFilm::WriteImage(GBufferFilm *this,ImageMetadata *metadata,Float splatScale)

{
  Image image;
  string local_150;
  Image local_130;
  
  GetImage(&local_130,this,metadata,splatScale);
  if (LOGGING_LogLevel < 1) {
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string&,pbrt::Bounds2<int>&>
              (&local_150,"Writing image %s with bounds %s",&(this->super_FilmBase).filename,
               &(this->super_FilmBase).pixelBounds);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
        ,0x29e,local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
  }
  Image::Write(&local_130,&(this->super_FilmBase).filename,metadata);
  local_130.p32.nStored = 0;
  (*(local_130.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_130.p32.alloc.memoryResource,local_130.p32.ptr,local_130.p32.nAlloc << 2,4);
  local_130.p16.nStored = 0;
  (*(local_130.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_130.p16.alloc.memoryResource,local_130.p16.ptr,local_130.p16.nAlloc * 2,2);
  local_130.p8.nStored = 0;
  (*(local_130.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_130.p8.alloc.memoryResource,local_130.p8.ptr,local_130.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_130.channelNames);
  return;
}

Assistant:

void GBufferFilm::WriteImage(ImageMetadata metadata, Float splatScale) {
    Image image = GetImage(&metadata, splatScale);
    LOG_VERBOSE("Writing image %s with bounds %s", filename, pixelBounds);
    image.Write(filename, metadata);
}